

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void wtree(wtree_object wt,double *inp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *inp_00;
  double dVar4;
  double *orig;
  int it1;
  int t2;
  int t;
  int len_cA;
  int Np;
  int N2;
  int k;
  int p2;
  int lp;
  int N;
  int iter;
  int temp_len;
  int J;
  int i;
  double *inp_local;
  wtree_object wt_local;
  
  N = wt->siglength;
  iVar1 = wt->J;
  wt->length[iVar1 + 1] = N;
  wt->outlength = 0;
  wt->zpad = 0;
  inp_00 = (double *)malloc((long)N << 3);
  for (temp_len = 0; temp_len < wt->siglength; temp_len = temp_len + 1) {
    inp_00[temp_len] = inp[temp_len];
  }
  if (wt->zpad == 1) {
    inp_00[N + -1] = inp_00[N + -2];
  }
  iVar2 = wt->wave->lpd_len;
  iVar3 = strcmp(wt->ext,"per");
  p2 = N;
  temp_len = iVar1;
  if (iVar3 == 0) {
    N2 = 2;
    for (; 0 < temp_len; temp_len = temp_len + -1) {
      dVar4 = ceil((double)p2 / 2.0);
      p2 = (int)dVar4;
      wt->length[temp_len] = p2;
      wt->outlength = N2 * wt->length[temp_len] + wt->outlength;
      N2 = N2 << 1;
    }
    wt->length[0] = wt->length[1];
    len_cA = wt->outlength;
    N2 = 1;
    for (lp = 0; lp < iVar1; lp = lp + 1) {
      iVar2 = wt->length[iVar1 - lp];
      len_cA = len_cA - N2 * 2 * iVar2;
      p2 = len_cA;
      for (Np = 0; Np < N2; Np = Np + 1) {
        if (lp == 0) {
          wtree_per(wt,inp_00,N,(double *)(wt[1].method + (long)p2 * 8 + -0x10),iVar2,
                    (double *)(wt[1].method + (long)iVar2 * 8 + (long)p2 * 8 + -0x10));
        }
        else {
          wtree_per(wt,(double *)(wt[1].method + (long)(Np * N) * 8 + (long)t * 8 + -0x10),N,
                    (double *)(wt[1].method + (long)p2 * 8 + -0x10),iVar2,
                    (double *)(wt[1].method + (long)iVar2 * 8 + (long)p2 * 8 + -0x10));
        }
        p2 = iVar2 * 2 + p2;
      }
      N = wt->length[iVar1 - lp];
      N2 = N2 << 1;
      t = len_cA;
    }
  }
  else {
    iVar3 = strcmp(wt->ext,"sym");
    if (iVar3 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    N2 = 2;
    for (; 0 < temp_len; temp_len = temp_len + -1) {
      dVar4 = ceil((double)(p2 + iVar2 + -2) / 2.0);
      p2 = (int)dVar4;
      wt->length[temp_len] = p2;
      wt->outlength = N2 * wt->length[temp_len] + wt->outlength;
      N2 = N2 << 1;
    }
    wt->length[0] = wt->length[1];
    len_cA = wt->outlength;
    N2 = 1;
    for (lp = 0; lp < iVar1; lp = lp + 1) {
      iVar2 = wt->length[iVar1 - lp];
      len_cA = len_cA - N2 * 2 * iVar2;
      p2 = len_cA;
      for (Np = 0; Np < N2; Np = Np + 1) {
        if (lp == 0) {
          wtree_sym(wt,inp_00,N,(double *)(wt[1].method + (long)p2 * 8 + -0x10),iVar2,
                    (double *)(wt[1].method + (long)iVar2 * 8 + (long)p2 * 8 + -0x10));
        }
        else {
          wtree_sym(wt,(double *)(wt[1].method + (long)(Np * N) * 8 + (long)t * 8 + -0x10),N,
                    (double *)(wt[1].method + (long)p2 * 8 + -0x10),iVar2,
                    (double *)(wt[1].method + (long)iVar2 * 8 + (long)p2 * 8 + -0x10));
        }
        p2 = iVar2 * 2 + p2;
      }
      N = wt->length[iVar1 - lp];
      N2 = N2 << 1;
      t = len_cA;
    }
  }
  iVar1 = wt->J;
  orig._4_4_ = wt->outlength + wt->length[iVar1] * -2;
  N2 = 2;
  orig._0_4_ = 0;
  for (temp_len = 0; temp_len < iVar1; temp_len = temp_len + 1) {
    it1 = orig._4_4_;
    for (Np = 0; Np < N2; Np = Np + 1) {
      wt->nodelength[(int)orig] = it1;
      orig._0_4_ = (int)orig + 1;
      it1 = wt->length[iVar1 - temp_len] + it1;
    }
    N2 = N2 * 2;
    orig._4_4_ = orig._4_4_ - N2 * wt->length[(iVar1 - temp_len) + -1];
  }
  *wt->coeflength = wt->siglength;
  for (temp_len = 1; temp_len < iVar1 + 1; temp_len = temp_len + 1) {
    wt->coeflength[temp_len] = wt->length[(iVar1 - temp_len) + 1];
  }
  free(inp_00);
  return;
}

Assistant:

void wtree(wtree_object wt,const double *inp) {
	int i,J,temp_len,iter,N,lp,p2,k,N2,Np;
	int len_cA,t,t2,it1;
	double *orig;

	temp_len = wt->siglength;
	J = wt->J;
	wt->length[J + 1] = temp_len;
	wt->outlength = 0;
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	/*
	if ((temp_len % 2) == 0) {
		wt->zpad = 0;
		orig = (double*)malloc(sizeof(double)* temp_len);
	}
	else {
		wt->zpad = 1;
		temp_len++;
		orig = (double*)malloc(sizeof(double)* temp_len);
	}
	*/
	for (i = 0; i < wt->siglength; ++i) {
		orig[i] = inp[i];
	}

	if (wt->zpad == 1) {
		orig[temp_len - 1] = orig[temp_len - 2];
	}

	N = temp_len;
	lp = wt->wave->lpd_len;
        p2 = 1;

	if (!strcmp(wt->ext,"per")) {
		i = J;
                p2 = 2;
		while (i > 0) {
			N = (int)ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += p2 * (wt->length[i]);
			i--;
                        p2 *= 2;
		}
		wt->length[0] = wt->length[1];

		N2 = N = wt->outlength;
                p2 = 1;
		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
                        N2 -= 2 * p2 * len_cA;
                        N = N2;
                        for(k = 0; k < p2;++k) {
                            if (iter == 0) {
                               wtree_per(wt, orig, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            } else {
                                wtree_per(wt, wt->params + Np + k * temp_len, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            }
                            N += 2 * len_cA;
                        }

			temp_len = wt->length[J - iter];
			p2 = 2 * p2;
            Np = N2;
		}
	}
	else if (!strcmp(wt->ext,"sym")) {
		//printf("\n YES %s \n", wt->ext);
		i = J;
                p2 = 2;
		while (i > 0) {
			N = N + lp - 2;
			N = (int) ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += p2 * (wt->length[i]);
			i--;
                        p2 *= 2;
		}
		wt->length[0] = wt->length[1];

		N2 = N = wt->outlength;
                p2 = 1;

                for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
                        N2 -= 2 * p2 * len_cA;
                        N = N2;
                        for(k = 0; k < p2;++k) {
                            if (iter == 0) {
                                wtree_sym(wt, orig, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            } else {
                                wtree_sym(wt, wt->params + Np + k * temp_len, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            }
                            N += 2 * len_cA;
                        }

			temp_len = wt->length[J - iter];
			p2 = 2 * p2;
            Np = N2;
		}

	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	J = wt->J;
	t2 = wt->outlength - 2 * wt->length[J];
	p2 = 2;
	it1 = 0;
	for (i = 0; i < J; ++i) {
		t = t2;
		for (k = 0; k < p2; ++k) {
			wt->nodelength[it1] = t;
			it1++;
			t += wt->length[J - i];
		}
		p2 *= 2;
		t2 = t2 - p2 * wt->length[J - i - 1];
	}

	wt->coeflength[0] = wt->siglength;

	for (i = 1; i < J + 1; ++i) {
		wt->coeflength[i] = wt->length[J - i + 1];
	}

	free(orig);
}